

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *
CfdTestGenerateUtxo(NetType net_type,HDWallet *wallet,string *base_path,Amount *amount,
                   uint32_t offset,uint32_t count,
                   vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *privkey_list)

{
  string *in_RDX;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_RDI;
  undefined8 *in_R8;
  uint in_R9D;
  int in_stack_00000008;
  KeyData *in_stack_00000010;
  ByteData256 txid_bytes;
  DescriptorScriptReference ref;
  Descriptor desc;
  UtxoData utxo;
  KeyData key;
  string path;
  uint32_t index;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *list;
  value_type *in_stack_fffffffffffff138;
  KeyData *in_stack_fffffffffffff140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff148;
  string *this;
  undefined4 in_stack_fffffffffffff168;
  uint in_stack_fffffffffffff16c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff178;
  ByteData256 local_e78;
  Txid local_e60;
  string local_e28 [32];
  string local_e08 [32];
  string local_de8 [32];
  string local_dc8 [24];
  Address local_db0 [376];
  Script local_c38;
  vector local_c00 [848];
  string local_8b0 [360];
  string local_748 [32];
  string local_728 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  UtxoData local_6e8 [40];
  Txid local_6c0;
  uint local_6a0;
  Script local_698 [2];
  Address local_628 [376];
  string local_4b0 [32];
  undefined8 local_490;
  undefined1 local_488;
  undefined4 local_480;
  undefined1 local_1f8 [336];
  string local_a8 [48];
  string local_78 [32];
  string local_58 [36];
  uint local_34;
  undefined1 local_2d;
  uint local_2c;
  undefined8 *local_28;
  string *local_18;
  
  local_2d = 0;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_18 = in_RDX;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x24d17f);
  for (local_34 = local_2c; local_34 < local_2c + in_stack_00000008; local_34 = local_34 + 1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),(char *)in_RDI);
    std::__cxx11::to_string(in_stack_fffffffffffff16c);
    std::operator+(in_stack_fffffffffffff178,in_stack_fffffffffffff170);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_78);
    cfd::core::HDWallet::GeneratePrivkeyData((NetType)local_1f8,local_18);
    cfd::UtxoData::UtxoData(local_6e8);
    cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_748,0),(HardenedType)local_1f8,true);
    std::operator+((char *)in_stack_fffffffffffff148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff140);
    std::operator+(in_stack_fffffffffffff148,(char *)in_stack_fffffffffffff140);
    this = local_4b0;
    in_stack_fffffffffffff148 = &local_708;
    std::__cxx11::string::operator=(this,(string *)in_stack_fffffffffffff148);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffff148);
    std::__cxx11::string::~string(local_728);
    std::__cxx11::string::~string(local_748);
    local_488 = *(undefined1 *)(local_28 + 1);
    local_490 = *local_28;
    cfd::core::Descriptor::Parse(local_8b0,(vector *)this);
    cfd::core::Descriptor::GetReference(local_c00);
    cfd::core::DescriptorScriptReference::GetLockingScript();
    cfd::core::Script::operator=(local_698,&local_c38);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff140);
    cfd::core::DescriptorScriptReference::GenerateAddress((NetType)local_db0);
    cfd::core::Address::operator=(local_628,local_db0);
    cfd::core::Address::~Address((Address *)in_stack_fffffffffffff140);
    local_480 = 4;
    cfd::core::HDWallet::GetSeed();
    cfd::core::ByteData::GetHex_abi_cxx11_();
    std::operator+(in_stack_fffffffffffff148,(char *)in_stack_fffffffffffff140);
    std::operator+(in_stack_fffffffffffff148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff140);
    cfd::core::HashUtil::Sha256(local_dc8);
    std::__cxx11::string::~string(local_de8);
    std::__cxx11::string::~string(local_e08);
    std::__cxx11::string::~string(local_e28);
    cfd::core::ByteData::~ByteData((ByteData *)0x24d47b);
    cfd::core::ByteData256::ByteData256
              ((ByteData256 *)in_stack_fffffffffffff140,(ByteData256 *)in_stack_fffffffffffff138);
    cfd::core::Txid::Txid(&local_e60,&local_e78);
    cfd::core::Txid::operator=(&local_6c0,&local_e60);
    cfd::core::Txid::~Txid((Txid *)0x24d4be);
    cfd::core::ByteData256::~ByteData256((ByteData256 *)0x24d4c8);
    local_6a0 = local_34;
    std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::emplace_back<cfd::UtxoData&>
              ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this,
               (UtxoData *)in_stack_fffffffffffff148);
    if (in_stack_00000010 != (KeyData *)0x0) {
      in_stack_fffffffffffff140 = in_stack_00000010;
      cfd::core::KeyData::GetPrivkey();
      std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::push_back
                ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
                 in_stack_fffffffffffff140,in_stack_fffffffffffff138);
      cfd::core::Privkey::~Privkey((Privkey *)0x24d535);
    }
    cfd::core::ByteData256::~ByteData256((ByteData256 *)0x24d7c6);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)in_stack_fffffffffffff140);
    cfd::core::Descriptor::~Descriptor((Descriptor *)0x24d7e0);
    cfd::UtxoData::~UtxoData((UtxoData *)in_stack_fffffffffffff140);
    cfd::core::KeyData::~KeyData(in_stack_fffffffffffff140);
    std::__cxx11::string::~string(local_58);
  }
  return in_RDI;
}

Assistant:

static std::vector<UtxoData> CfdTestGenerateUtxo(
    NetType net_type, const HDWallet& wallet, const std::string& base_path,
    const Amount& amount, uint32_t offset, uint32_t count,
    std::vector<Privkey>* privkey_list) {
  std::vector<UtxoData> list;
  for (uint32_t index=offset; index<(offset + count); ++index) {
    std::string path = base_path + "/" + std::to_string(index);
    auto key = wallet.GeneratePrivkeyData(net_type, path);
    UtxoData utxo;
    utxo.descriptor = "wpkh(" + key.ToString() + ")";
    utxo.amount = amount;
    Descriptor desc = Descriptor::Parse(utxo.descriptor);
    auto ref = desc.GetReference();
    utxo.locking_script = ref.GetLockingScript();
    utxo.address = ref.GenerateAddress(net_type);
    utxo.address_type  = AddressType::kP2wpkhAddress;
    auto txid_bytes = HashUtil::Sha256(wallet.GetSeed().GetHex() + "/" + path);
    utxo.txid = Txid(ByteData256(txid_bytes));
    utxo.vout = index;
    list.emplace_back(utxo);
    if (privkey_list != nullptr) {
      privkey_list->push_back(key.GetPrivkey());
    }
  }
  return list;
}